

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

HistoryEntry * __thiscall QTextBrowserPrivate::createHistoryEntry(QTextBrowserPrivate *this)

{
  bool bVar1;
  ResourceType RVar2;
  int iVar3;
  ulong uVar4;
  QTextBrowserPrivate *in_RSI;
  HistoryEntry *in_RDI;
  long in_FS_OFFSET;
  HistoryEntry *entry;
  QTextCursor cursor;
  QTextBrowser *in_stack_ffffffffffffff98;
  HistoryEntry *this_00;
  undefined1 *local_30 [4];
  QUrl local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  memset(in_RDI,0xaa,0x38);
  HistoryEntry::HistoryEntry(in_RDI);
  q_func(in_RSI);
  QTextBrowser::source((QTextBrowser *)this_00);
  QUrl::operator=(&in_RDI->url,(QUrl *)in_stack_ffffffffffffff98);
  QUrl::~QUrl(&local_10);
  q_func(in_RSI);
  RVar2 = QTextBrowser::sourceType(in_stack_ffffffffffffff98);
  this_00->type = RVar2;
  q_func(in_RSI);
  QTextEdit::documentTitle((QTextEdit *)this_00);
  QString::operator=((QString *)in_RDI,(QString *)in_stack_ffffffffffffff98);
  QString::~QString((QString *)0x6de0f5);
  iVar3 = QAbstractSlider::value((QAbstractSlider *)in_RDI);
  this_00->hpos = iVar3;
  iVar3 = QAbstractSlider::value((QAbstractSlider *)in_RDI);
  this_00->vpos = iVar3;
  local_30[0] = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::textCursor((QWidgetTextControl *)this_00);
  bVar1 = QWidgetTextControl::cursorIsFocusIndicator((QWidgetTextControl *)in_RDI);
  if ((bVar1) && (uVar4 = QTextCursor::hasSelection(), (uVar4 & 1) != 0)) {
    iVar3 = QTextCursor::position();
    this_00->focusIndicatorPosition = iVar3;
    iVar3 = QTextCursor::anchor();
    this_00->focusIndicatorAnchor = iVar3;
  }
  QTextCursor::~QTextCursor((QTextCursor *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTextBrowserPrivate::HistoryEntry QTextBrowserPrivate::createHistoryEntry() const
{
    HistoryEntry entry;
    entry.url = q_func()->source();
    entry.type = q_func()->sourceType();
    entry.title = q_func()->documentTitle();
    entry.hpos = hbar->value();
    entry.vpos = vbar->value();

    const QTextCursor cursor = control->textCursor();
    if (control->cursorIsFocusIndicator()
        && cursor.hasSelection()) {

        entry.focusIndicatorPosition = cursor.position();
        entry.focusIndicatorAnchor = cursor.anchor();
    }
    return entry;
}